

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

int Render_Single_Pass(black_PWorker worker,Bool flipped,Int y_min,Int y_max)

{
  Bool BVar1;
  Int band_stack [32];
  int local_2c;
  Int band_top;
  Int y_mid;
  Int y_max_local;
  Int y_min_local;
  Bool flipped_local;
  black_PWorker worker_local;
  
  local_2c = 0;
  band_top = y_max;
  y_mid = y_min;
  while( true ) {
    while( true ) {
      worker->minY = (long)y_mid * (long)worker->precision;
      worker->maxY = (long)band_top * (long)worker->precision;
      worker->top = worker->buff;
      worker->error = 0;
      BVar1 = Convert_Glyph(worker,(int)flipped);
      if (BVar1 != '\0') break;
      if ((worker->fProfile != (PProfile_conflict)0x0) &&
         (BVar1 = Draw_Sweep(worker), BVar1 != '\0')) {
        return worker->error;
      }
      local_2c = local_2c + -1;
      if (local_2c < 0) {
        return 0;
      }
      band_top = y_mid + -1;
      y_mid = band_stack[(long)local_2c + -2];
    }
    if (worker->error != 0x62) {
      return worker->error;
    }
    if (y_mid == band_top) break;
    band_stack[(long)local_2c + -2] = y_mid;
    y_mid = (y_mid + band_top >> 1) + 1;
    local_2c = local_2c + 1;
  }
  return worker->error;
}

Assistant:

static int
  Render_Single_Pass( RAS_ARGS Bool  flipped,
                               Int   y_min,
                               Int   y_max )
  {
    Int  y_mid;
    Int  band_top = 0;
    Int  band_stack[32];  /* enough to bisect 32-bit int bands */


    while ( 1 )
    {
      ras.minY = (Long)y_min * ras.precision;
      ras.maxY = (Long)y_max * ras.precision;

      ras.top = ras.buff;

      ras.error = Raster_Err_Ok;

      if ( Convert_Glyph( RAS_VARS flipped ) )
      {
        if ( ras.error != Raster_Err_Raster_Overflow )
          return ras.error;

        /* sub-banding */

        if ( y_min == y_max )
          return ras.error;  /* still Raster_Overflow */

        y_mid = ( y_min + y_max ) >> 1;

        band_stack[band_top++] = y_min;
        y_min                  = y_mid + 1;
      }
      else
      {
        if ( ras.fProfile )
          if ( Draw_Sweep( RAS_VAR ) )
             return ras.error;

        if ( --band_top < 0 )
          break;

        y_max = y_min - 1;
        y_min = band_stack[band_top];
      }
    }

    return Raster_Err_Ok;
  }